

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

Bool_conflict unRLE_obuf_to_output_FAST(DState *s)

{
  UInt32 UVar1;
  uint uVar2;
  int iVar3;
  UInt32 *pUVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint total_out_lo32_old;
  Int32 s_save_nblockPP;
  UInt32 avail_out_INIT;
  Int32 ro_blockSize100k;
  uint cs_avail_out;
  char *cs_next_out;
  UInt32 c_tPos;
  UInt32 *c_tt;
  Int32 c_k0;
  Int32 c_nblock_used;
  Int32 c_state_out_len;
  UChar c_state_out_ch;
  UInt32 c_calculatedBlockCRC;
  UChar k1;
  DState *s_local;
  
  if (s->blockRandomised != '\0') {
    while( true ) {
      while( true ) {
        if (s->strm->avail_out == 0) {
          return '\0';
        }
        if (s->state_out_len == 0) break;
        *s->strm->next_out = s->state_out_ch;
        s->calculatedBlockCRC =
             s->calculatedBlockCRC << 8 ^
             BZ2_crc32Table[s->calculatedBlockCRC >> 0x18 ^ (uint)s->state_out_ch];
        s->state_out_len = s->state_out_len + -1;
        s->strm->next_out = s->strm->next_out + 1;
        s->strm->avail_out = s->strm->avail_out - 1;
        s->strm->total_out_lo32 = s->strm->total_out_lo32 + 1;
        if (s->strm->total_out_lo32 == 0) {
          s->strm->total_out_hi32 = s->strm->total_out_hi32 + 1;
        }
      }
      if (s->nblock_used == s->save_nblock + 1) {
        return '\0';
      }
      if (s->save_nblock + 1 < s->nblock_used) {
        return '\x01';
      }
      s->state_out_len = 1;
      s->state_out_ch = (UChar)s->k0;
      if ((uint)(s->blockSize100k * 100000) <= s->tPos) break;
      s->tPos = s->tt[s->tPos];
      UVar1 = s->tPos;
      s->tPos = s->tPos >> 8;
      if (s->rNToGo == 0) {
        s->rNToGo = BZ2_rNums[s->rTPos];
        s->rTPos = s->rTPos + 1;
        if (s->rTPos == 0x200) {
          s->rTPos = 0;
        }
      }
      s->rNToGo = s->rNToGo + -1;
      bVar5 = (byte)UVar1 ^ s->rNToGo == 1;
      s->nblock_used = s->nblock_used + 1;
      if (s->nblock_used != s->save_nblock + 1) {
        if ((uint)bVar5 == s->k0) {
          s->state_out_len = 2;
          if ((uint)(s->blockSize100k * 100000) <= s->tPos) {
            return '\x01';
          }
          s->tPos = s->tt[s->tPos];
          UVar1 = s->tPos;
          s->tPos = s->tPos >> 8;
          if (s->rNToGo == 0) {
            s->rNToGo = BZ2_rNums[s->rTPos];
            s->rTPos = s->rTPos + 1;
            if (s->rTPos == 0x200) {
              s->rTPos = 0;
            }
          }
          s->rNToGo = s->rNToGo + -1;
          bVar5 = (byte)UVar1 ^ s->rNToGo == 1;
          s->nblock_used = s->nblock_used + 1;
          if (s->nblock_used != s->save_nblock + 1) {
            if ((uint)bVar5 == s->k0) {
              s->state_out_len = 3;
              if ((uint)(s->blockSize100k * 100000) <= s->tPos) {
                return '\x01';
              }
              s->tPos = s->tt[s->tPos];
              UVar1 = s->tPos;
              s->tPos = s->tPos >> 8;
              if (s->rNToGo == 0) {
                s->rNToGo = BZ2_rNums[s->rTPos];
                s->rTPos = s->rTPos + 1;
                if (s->rTPos == 0x200) {
                  s->rTPos = 0;
                }
              }
              s->rNToGo = s->rNToGo + -1;
              bVar5 = (byte)UVar1 ^ s->rNToGo == 1;
              s->nblock_used = s->nblock_used + 1;
              if (s->nblock_used != s->save_nblock + 1) {
                if ((uint)bVar5 == s->k0) {
                  if ((uint)(s->blockSize100k * 100000) <= s->tPos) {
                    return '\x01';
                  }
                  s->tPos = s->tt[s->tPos];
                  UVar1 = s->tPos;
                  s->tPos = s->tPos >> 8;
                  if (s->rNToGo == 0) {
                    s->rNToGo = BZ2_rNums[s->rTPos];
                    s->rTPos = s->rTPos + 1;
                    if (s->rTPos == 0x200) {
                      s->rTPos = 0;
                    }
                  }
                  s->rNToGo = s->rNToGo + -1;
                  s->nblock_used = s->nblock_used + 1;
                  s->state_out_len = (byte)((byte)UVar1 ^ s->rNToGo == 1) + 4;
                  if ((uint)(s->blockSize100k * 100000) <= s->tPos) {
                    return '\x01';
                  }
                  s->tPos = s->tt[s->tPos];
                  s->k0 = s->tPos & 0xff;
                  s->tPos = s->tPos >> 8;
                  if (s->rNToGo == 0) {
                    s->rNToGo = BZ2_rNums[s->rTPos];
                    s->rTPos = s->rTPos + 1;
                    if (s->rTPos == 0x200) {
                      s->rTPos = 0;
                    }
                  }
                  s->rNToGo = s->rNToGo + -1;
                  s->k0 = (uint)(s->rNToGo == 1) ^ s->k0;
                  s->nblock_used = s->nblock_used + 1;
                }
                else {
                  s->k0 = (uint)bVar5;
                }
              }
            }
            else {
              s->k0 = (uint)bVar5;
            }
          }
        }
        else {
          s->k0 = (uint)bVar5;
        }
      }
    }
    return '\x01';
  }
  c_state_out_len = s->calculatedBlockCRC;
  c_nblock_used._3_1_ = s->state_out_ch;
  c_k0 = s->state_out_len;
  c_tt._0_4_ = s->k0;
  pUVar4 = s->tt;
  cs_next_out._4_4_ = s->tPos;
  _ro_blockSize100k = (byte *)s->strm->next_out;
  uVar2 = s->strm->avail_out;
  iVar3 = s->blockSize100k;
  iVar6 = s->save_nblock + 1;
  avail_out_INIT = uVar2;
  iVar7 = s->nblock_used;
  do {
    c_tt._4_4_ = iVar7;
    if (c_k0 < 1) goto LAB_00950cef;
    while( true ) {
      if (avail_out_INIT == 0) goto LAB_00950ee5;
      iVar7 = c_tt._4_4_;
      if (c_k0 == 1) break;
      *_ro_blockSize100k = c_nblock_used._3_1_;
      c_state_out_len =
           c_state_out_len << 8 ^
           BZ2_crc32Table[(uint)c_state_out_len >> 0x18 ^ (uint)c_nblock_used._3_1_];
      c_k0 = c_k0 + -1;
      _ro_blockSize100k = _ro_blockSize100k + 1;
      avail_out_INIT = avail_out_INIT - 1;
    }
LAB_00950c9c:
    do {
      c_tt._4_4_ = iVar7;
      if (avail_out_INIT == 0) {
        c_k0 = 1;
        goto LAB_00950ee5;
      }
      *_ro_blockSize100k = c_nblock_used._3_1_;
      c_state_out_len =
           c_state_out_len << 8 ^
           BZ2_crc32Table[(uint)c_state_out_len >> 0x18 ^ (uint)c_nblock_used._3_1_];
      _ro_blockSize100k = _ro_blockSize100k + 1;
      avail_out_INIT = avail_out_INIT - 1;
LAB_00950cef:
      if (iVar6 < c_tt._4_4_) {
        return '\x01';
      }
      if (c_tt._4_4_ == iVar6) {
        c_k0 = 0;
LAB_00950ee5:
        uVar8 = s->strm->total_out_lo32;
        s->strm->total_out_lo32 = (uVar2 - avail_out_INIT) + s->strm->total_out_lo32;
        if (s->strm->total_out_lo32 < uVar8) {
          s->strm->total_out_hi32 = s->strm->total_out_hi32 + 1;
        }
        s->calculatedBlockCRC = c_state_out_len;
        s->state_out_ch = c_nblock_used._3_1_;
        s->state_out_len = c_k0;
        s->nblock_used = c_tt._4_4_;
        s->k0 = (uint)c_tt;
        s->tt = pUVar4;
        s->tPos = cs_next_out._4_4_;
        s->strm->next_out = (char *)_ro_blockSize100k;
        s->strm->avail_out = avail_out_INIT;
        return '\0';
      }
      c_nblock_used._3_1_ = (byte)(uint)c_tt;
      if ((uint)(iVar3 * 100000) <= cs_next_out._4_4_) {
        return '\x01';
      }
      uVar8 = pUVar4[cs_next_out._4_4_];
      cs_next_out._4_4_ = uVar8 >> 8;
      iVar7 = c_tt._4_4_ + 1;
      if ((uVar8 & 0xff) != (uint)c_tt) {
        c_tt._0_4_ = uVar8 & 0xff;
        goto LAB_00950c9c;
      }
    } while (iVar7 == iVar6);
    c_k0 = 2;
    if ((uint)(iVar3 * 100000) <= cs_next_out._4_4_) {
      return '\x01';
    }
    uVar8 = pUVar4[cs_next_out._4_4_];
    cs_next_out._4_4_ = uVar8 >> 8;
    iVar7 = c_tt._4_4_ + 2;
    if (iVar7 != iVar6) {
      if ((uVar8 & 0xff) == (uint)c_tt) {
        c_k0 = 3;
        if ((uint)(iVar3 * 100000) <= cs_next_out._4_4_) {
          return '\x01';
        }
        uVar8 = pUVar4[cs_next_out._4_4_];
        cs_next_out._4_4_ = uVar8 >> 8;
        iVar7 = c_tt._4_4_ + 3;
        if (iVar7 != iVar6) {
          if ((uVar8 & 0xff) == (uint)c_tt) {
            if ((uint)(iVar3 * 100000) <= cs_next_out._4_4_) {
              return '\x01';
            }
            uVar8 = pUVar4[cs_next_out._4_4_] >> 8;
            c_k0 = (pUVar4[cs_next_out._4_4_] & 0xff) + 4;
            if ((uint)(iVar3 * 100000) <= uVar8) {
              return '\x01';
            }
            c_tt._0_4_ = pUVar4[uVar8] & 0xff;
            cs_next_out._4_4_ = pUVar4[uVar8] >> 8;
            iVar7 = c_tt._4_4_ + 5;
          }
          else {
            c_tt._0_4_ = uVar8 & 0xff;
          }
        }
      }
      else {
        c_tt._0_4_ = uVar8 & 0xff;
      }
    }
  } while( true );
}

Assistant:

static
Bool unRLE_obuf_to_output_FAST ( DState* s )
{
   UChar k1;

   if (s->blockRandomised) {

      while (True) {
         /* try to finish existing run */
         while (True) {
            if (s->strm->avail_out == 0) return False;
            if (s->state_out_len == 0) break;
            *( (UChar*)(s->strm->next_out) ) = s->state_out_ch;
            BZ_UPDATE_CRC ( s->calculatedBlockCRC, s->state_out_ch );
            s->state_out_len--;
            s->strm->next_out++;
            s->strm->avail_out--;
            s->strm->total_out_lo32++;
            if (s->strm->total_out_lo32 == 0) s->strm->total_out_hi32++;
         }

         /* can a new run be started? */
         if (s->nblock_used == s->save_nblock+1) return False;
               
         /* Only caused by corrupt data stream? */
         if (s->nblock_used > s->save_nblock+1)
            return True;
   
         s->state_out_len = 1;
         s->state_out_ch = s->k0;
         BZ_GET_FAST(k1); BZ_RAND_UPD_MASK; 
         k1 ^= BZ_RAND_MASK; s->nblock_used++;
         if (s->nblock_used == s->save_nblock+1) continue;
         if (k1 != s->k0) { s->k0 = k1; continue; };
   
         s->state_out_len = 2;
         BZ_GET_FAST(k1); BZ_RAND_UPD_MASK; 
         k1 ^= BZ_RAND_MASK; s->nblock_used++;
         if (s->nblock_used == s->save_nblock+1) continue;
         if (k1 != s->k0) { s->k0 = k1; continue; };
   
         s->state_out_len = 3;
         BZ_GET_FAST(k1); BZ_RAND_UPD_MASK; 
         k1 ^= BZ_RAND_MASK; s->nblock_used++;
         if (s->nblock_used == s->save_nblock+1) continue;
         if (k1 != s->k0) { s->k0 = k1; continue; };
   
         BZ_GET_FAST(k1); BZ_RAND_UPD_MASK; 
         k1 ^= BZ_RAND_MASK; s->nblock_used++;
         s->state_out_len = ((Int32)k1) + 4;
         BZ_GET_FAST(s->k0); BZ_RAND_UPD_MASK; 
         s->k0 ^= BZ_RAND_MASK; s->nblock_used++;
      }

   } else {

      /* restore */
      UInt32        c_calculatedBlockCRC = s->calculatedBlockCRC;
      UChar         c_state_out_ch       = s->state_out_ch;
      Int32         c_state_out_len      = s->state_out_len;
      Int32         c_nblock_used        = s->nblock_used;
      Int32         c_k0                 = s->k0;
      UInt32*       c_tt                 = s->tt;
      UInt32        c_tPos               = s->tPos;
      char*         cs_next_out          = s->strm->next_out;
      unsigned int  cs_avail_out         = s->strm->avail_out;
      Int32         ro_blockSize100k     = s->blockSize100k;
      /* end restore */

      UInt32       avail_out_INIT = cs_avail_out;
      Int32        s_save_nblockPP = s->save_nblock+1;
      unsigned int total_out_lo32_old;

      while (True) {

         /* try to finish existing run */
         if (c_state_out_len > 0) {
            while (True) {
               if (cs_avail_out == 0) goto return_notr;
               if (c_state_out_len == 1) break;
               *( (UChar*)(cs_next_out) ) = c_state_out_ch;
               BZ_UPDATE_CRC ( c_calculatedBlockCRC, c_state_out_ch );
               c_state_out_len--;
               cs_next_out++;
               cs_avail_out--;
            }
            s_state_out_len_eq_one:
            {
               if (cs_avail_out == 0) { 
                  c_state_out_len = 1; goto return_notr;
               };
               *( (UChar*)(cs_next_out) ) = c_state_out_ch;
               BZ_UPDATE_CRC ( c_calculatedBlockCRC, c_state_out_ch );
               cs_next_out++;
               cs_avail_out--;
            }
         }   
         /* Only caused by corrupt data stream? */
         if (c_nblock_used > s_save_nblockPP)
            return True;

         /* can a new run be started? */
         if (c_nblock_used == s_save_nblockPP) {
            c_state_out_len = 0; goto return_notr;
         };   
         c_state_out_ch = c_k0;
         BZ_GET_FAST_C(k1); c_nblock_used++;
         if (k1 != c_k0) { 
            c_k0 = k1; goto s_state_out_len_eq_one; 
         };
         if (c_nblock_used == s_save_nblockPP) 
            goto s_state_out_len_eq_one;
   
         c_state_out_len = 2;
         BZ_GET_FAST_C(k1); c_nblock_used++;
         if (c_nblock_used == s_save_nblockPP) continue;
         if (k1 != c_k0) { c_k0 = k1; continue; };
   
         c_state_out_len = 3;
         BZ_GET_FAST_C(k1); c_nblock_used++;
         if (c_nblock_used == s_save_nblockPP) continue;
         if (k1 != c_k0) { c_k0 = k1; continue; };
   
         BZ_GET_FAST_C(k1); c_nblock_used++;
         c_state_out_len = ((Int32)k1) + 4;
         BZ_GET_FAST_C(c_k0); c_nblock_used++;
      }

      return_notr:
      total_out_lo32_old = s->strm->total_out_lo32;
      s->strm->total_out_lo32 += (avail_out_INIT - cs_avail_out);
      if (s->strm->total_out_lo32 < total_out_lo32_old)
         s->strm->total_out_hi32++;

      /* save */
      s->calculatedBlockCRC = c_calculatedBlockCRC;
      s->state_out_ch       = c_state_out_ch;
      s->state_out_len      = c_state_out_len;
      s->nblock_used        = c_nblock_used;
      s->k0                 = c_k0;
      s->tt                 = c_tt;
      s->tPos               = c_tPos;
      s->strm->next_out     = cs_next_out;
      s->strm->avail_out    = cs_avail_out;
      /* end save */
   }
   return False;
}